

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

char * __thiscall pstack::Exception::what(Exception *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Exception *local_10;
  Exception *this_local;
  
  local_10 = this;
  std::__cxx11::ostringstream::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->intermediate,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->intermediate);
  return pcVar1;
}

Assistant:

const char *what() const noexcept {
        intermediate = str.str();
        return intermediate.c_str();
    }